

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O2

char * lstep(re_guts *g,sopno start,sopno stop,char *bef,int ch,char *aft)

{
  sop sVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  uVar5 = start & 0xffffffff;
  do {
    iVar8 = (int)uVar5;
    if (start == stop) {
      return aft;
    }
    sVar1 = g->strip[start];
    uVar4 = (uint)sVar1;
    uVar5 = (ulong)(uVar4 & 0x7c000000) - 0x4000000 >> 0x1a;
    if (uVar5 - 1 < 0x13) {
      lVar6 = (long)iVar8;
      switch(uVar5) {
      case 1:
        if ((char)sVar1 == ch) {
LAB_001092a2:
          bVar3 = bef[lVar6];
          goto LAB_001092a6;
        }
        break;
      case 2:
        if ((ch & 0xfffffffdU) == 0x81) goto LAB_001092a2;
        break;
      case 3:
        if ((ch & 0xfffffffeU) == 0x82) goto LAB_001092a2;
        break;
      case 4:
        if (ch < 0x80) goto LAB_001092a2;
        break;
      case 5:
        if ((ch < 0x80) &&
           (uVar5 = (ulong)((uVar4 & 0x3ffffff) << 5),
           (*(byte *)(*(long *)((long)&g->sets->ptr + uVar5) + (ulong)(ch & 0xff)) &
           (&g->sets->mask)[uVar5]) != 0)) goto LAB_001092a2;
        break;
      default:
        bVar3 = aft[lVar6];
LAB_001092a6:
        aft[lVar6 + 1] = aft[lVar6 + 1] | bVar3;
        break;
      case 9:
        aft[lVar6 + 1] = aft[lVar6 + 1] | aft[lVar6];
        lVar7 = lVar6 - (ulong)(uVar4 & 0x3ffffff);
        bVar3 = aft[lVar7];
        bVar2 = aft[lVar6] | bVar3;
        aft[lVar7] = bVar2;
        if (bVar2 != 0 && bVar3 == 0) {
          start = start + ~(ulong)(uVar4 & 0x3ffffff);
          iVar8 = (int)start;
        }
        break;
      case 10:
      case 0xe:
        aft[lVar6 + 1] = aft[lVar6 + 1] | aft[lVar6];
        aft[(ulong)(uVar4 & 0x3ffffff) + lVar6] =
             aft[(ulong)(uVar4 & 0x3ffffff) + lVar6] | aft[lVar6];
        break;
      case 0xf:
        if (aft[lVar6] != 0) {
          lVar7 = 1;
          while (uVar4 = (uint)g->strip[start + lVar7], (uVar4 & 0x7c000000) != 0x48000000) {
            lVar7 = lVar7 + (ulong)(uVar4 & 0x3ffffff);
          }
          aft[lVar6 + lVar7] = aft[lVar6 + lVar7] | aft[lVar6];
        }
        break;
      case 0x10:
        aft[lVar6 + 1] = aft[lVar6 + 1] | aft[lVar6];
        if ((*(uint *)(g->strip + start + (ulong)(uVar4 & 0x3ffffff)) & 0x7c000000) != 0x48000000) {
          aft[lVar6 + (ulong)(uVar4 & 0x3ffffff)] =
               aft[lVar6 + (ulong)(uVar4 & 0x3ffffff)] | aft[lVar6];
        }
        break;
      case 0x12:
        if (ch == 0x85) goto LAB_001092a2;
        break;
      case 0x13:
        if (ch == 0x86) goto LAB_001092a2;
      }
    }
    start = start + 1;
    uVar5 = (ulong)(iVar8 + 1);
  } while( true );
}

Assistant:

static states
step(g, start, stop, bef, ch, aft)
register struct re_guts *g;
sopno start;			/* start state within strip */
sopno stop;			/* state after stop state within strip */
register states bef;		/* states reachable before */
int ch;				/* character or NONCHAR code */
register states aft;		/* states already known reachable after */
{
	register cset *cs;
	register sop s;
	register sopno pc;
	register onestate here;		/* note, macros know this name */
	register sopno look;
	register long i;

	for (pc = start, INIT(here, pc); pc != stop; pc++, INC(here)) {
		s = g->strip[pc];
		switch (OP(s)) {
		case OEND:
			assert(pc == stop-1);
			break;
		case OCHAR:
			/* only characters can match */
			assert(!NONCHAR(ch) || ch != (char)OPND(s));
			if (ch == (char)OPND(s))
				FWD(aft, bef, 1);
			break;
		case OBOL:
			if (ch == BOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OEOL:
			if (ch == EOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OBOW:
			if (ch == BOW)
				FWD(aft, bef, 1);
			break;
		case OEOW:
			if (ch == EOW)
				FWD(aft, bef, 1);
			break;
		case OANY:
			if (!NONCHAR(ch))
				FWD(aft, bef, 1);
			break;
		case OANYOF:
			cs = &g->sets[OPND(s)];
			if (!NONCHAR(ch) && CHIN(cs, ch))
				FWD(aft, bef, 1);
			break;
		case OBACK_:		/* ignored here */
		case O_BACK:
			FWD(aft, aft, 1);
			break;
		case OPLUS_:		/* forward, this is just an empty */
			FWD(aft, aft, 1);
			break;
		case O_PLUS:		/* both forward and back */
			FWD(aft, aft, 1);
			i = ISSETBACK(aft, OPND(s));
			BACK(aft, aft, OPND(s));
			if (!i && ISSETBACK(aft, OPND(s))) {
				/* oho, must reconsider loop body */
				pc -= OPND(s) + 1;
				INIT(here, pc);
			}
			break;
		case OQUEST_:		/* two branches, both forward */
			FWD(aft, aft, 1);
			FWD(aft, aft, OPND(s));
			break;
		case O_QUEST:		/* just an empty */
			FWD(aft, aft, 1);
			break;
		case OLPAREN:		/* not significant here */
		case ORPAREN:
			FWD(aft, aft, 1);
			break;
		case OCH_:		/* mark the first two branches */
			FWD(aft, aft, 1);
			assert(OP(g->strip[pc+OPND(s)]) == OOR2);
			FWD(aft, aft, OPND(s));
			break;
		case OOR1:		/* done a branch, find the O_CH */
			if (ISSTATEIN(aft, here)) {
				for (look = 1;
						OP(s = g->strip[pc+look]) != O_CH;
						look += OPND(s))
					assert(OP(s) == OOR2);
				FWD(aft, aft, look);
			}
			break;
		case OOR2:		/* propagate OCH_'s marking */
			FWD(aft, aft, 1);
			if (OP(g->strip[pc+OPND(s)]) != O_CH) {
				assert(OP(g->strip[pc+OPND(s)]) == OOR2);
				FWD(aft, aft, OPND(s));
			}
			break;
		case O_CH:		/* just empty */
			FWD(aft, aft, 1);
			break;
		default:		/* ooooops... */
			assert(nope);
			break;
		}
	}

	return(aft);
}